

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

char * testing::internal::GetAnsiColorCode(GTestColor color)

{
  char *pcVar1;
  
  if (color - COLOR_RED < 3) {
    pcVar1 = *(char **)(&DAT_0014ba70 + (ulong)(color - COLOR_RED) * 8);
  }
  else {
    pcVar1 = (char *)0x0;
  }
  return pcVar1;
}

Assistant:

const char* GetAnsiColorCode(GTestColor color) {
  switch (color) {
    case COLOR_RED:     return "1";
    case COLOR_GREEN:   return "2";
    case COLOR_YELLOW:  return "3";
    default:            return NULL;
  };
}